

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  uint iChanged;
  int in_EDX;
  Fts5Iter *in_RSI;
  Fts5Index *in_RDI;
  long in_FS_OFFSET;
  Fts5Index *unaff_retaddr;
  int iFirst;
  int bUseFrom;
  Fts5SegIter *pSeg;
  int bNewTerm;
  int local_3c;
  int in_stack_ffffffffffffffd0;
  Fts5SegIter *local_18;
  uint in_stack_fffffffffffffff0;
  int iVar1;
  Fts5SegIter *pIter_00;
  
  pIter_00 = *(Fts5SegIter **)(in_FS_OFFSET + 0x28);
  local_3c = in_EDX;
  do {
    if (in_RDI->rc != 0) {
LAB_0026fc50:
      if (*(Fts5SegIter **)(in_FS_OFFSET + 0x28) != pIter_00) {
        __stack_chk_fail();
      }
      return;
    }
    iChanged = (uint)in_RSI->aFirst[1].iFirst;
    iVar1 = 0;
    local_18 = in_RSI->aSeg + (int)iChanged;
    if ((local_3c == 0) || (local_18->pDlidx == (Fts5DlidxIter *)0x0)) {
      (*local_18->xNext)(in_RDI,local_18,(int *)&stack0xfffffffffffffff4);
    }
    else {
      fts5SegIterNextFrom(unaff_retaddr,pIter_00,(ulong)in_stack_fffffffffffffff0);
    }
    if (((local_18->pLeaf == (Fts5Data *)0x0) || (iVar1 != 0)) ||
       (iVar1 = fts5MultiIterAdvanceRowid(in_RSI,iChanged,&local_18), iVar1 != 0)) {
      fts5MultiIterAdvanced(in_RDI,in_RSI,in_EDX,in_stack_ffffffffffffffd0);
      fts5MultiIterSetEof(in_RSI);
      local_18 = in_RSI->aSeg + in_RSI->aFirst[1].iFirst;
      if (local_18->pLeaf == (Fts5Data *)0x0) goto LAB_0026fc50;
    }
    if (((in_RSI->bSkipEmpty == '\0') || (local_18->nPos != 0)) &&
       (iVar1 = fts5MultiIterIsDeleted(in_RSI), iVar1 == 0)) {
      (*in_RSI->xSetOutputs)(in_RSI,local_18);
      goto LAB_0026fc50;
    }
    local_3c = 0;
  } while( true );
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p,
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( (pIter->bSkipEmpty==0 || pSeg->nPos)
      && 0==fts5MultiIterIsDeleted(pIter)
    ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}